

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_deconvolutiondepthwise_batchnorm(NetOptimize *this)

{
  float fVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  long lVar6;
  long *plVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int *piVar11;
  pointer piVar12;
  ulong uVar13;
  size_type sVar14;
  void *__s;
  size_type __n;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  float fVar18;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  Mat local_a8;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar16 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar16 != 0) {
    uVar17 = lVar16 >> 3;
    lVar16 = 0;
    do {
      iVar8 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar16]->type);
      if (iVar8 == 0) {
        uVar13 = lVar16 + 1;
        if (uVar13 < uVar17) {
          iVar8 = *((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar16]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar9 = std::__cxx11::string::compare
                              ((char *)&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar13]->type);
            if (((iVar9 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar13],
                piVar11 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar11 == 4)) &&
               (*piVar11 == iVar8)) goto LAB_00164f76;
            uVar13 = uVar13 + 1;
          } while (uVar13 < uVar17);
        }
        else {
LAB_00164f76:
          if (uVar13 != uVar17) {
            ppLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar4[lVar16];
            pLVar5 = ppLVar4[uVar13];
            fprintf(_stderr,"fuse_deconvolutiondepthwise_batchnorm %s %s\n",
                    (pLVar3->name)._M_dataplus._M_p,(pLVar5->name)._M_dataplus._M_p);
            iVar8 = *(int *)&pLVar5[1]._vptr_Layer;
            __n = (size_type)iVar8;
            fVar1 = *(float *)((long)&pLVar5[1]._vptr_Layer + 4);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_48,__n,(allocator_type *)&local_a8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_60,__n,(allocator_type *)&local_a8);
            if (0 < iVar8) {
              sVar14 = 0;
              do {
                fVar18 = (float)pLVar5[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage[sVar14] + fVar1;
                if (fVar18 < 0.0) {
                  fVar18 = sqrtf(fVar18);
                }
                else {
                  fVar18 = SQRT(fVar18);
                }
                lVar6 = *(long *)&pLVar5[1].one_blob_only;
                local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[sVar14] =
                     *(float *)(*(long *)&pLVar5[2].support_tensor_storage + sVar14 * 4) -
                     (*(float *)(lVar6 + sVar14 * 4) *
                     *(float *)(pLVar5[1].name._M_dataplus._M_p + sVar14 * 4)) / fVar18;
                local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[sVar14] = *(float *)(lVar6 + sVar14 * 4) / fVar18;
                sVar14 = sVar14 + 1;
              } while (__n != sVar14);
            }
            if (*(int *)((long)&pLVar3[1].type._M_string_length + 4) == 0) {
              *(undefined4 *)((long)&pLVar3[1].type._M_string_length + 4) = 1;
              local_a8.cstep = 0;
              local_a8.data = (void *)0x0;
              local_a8.refcount._0_4_ = 0;
              local_a8.refcount._4_4_ = 0;
              local_a8.elemsize._0_4_ = 0;
              local_a8.elemsize._4_4_ = 0;
              local_a8.elempack = 0;
              local_a8.h = 0;
              local_a8.d = 0;
              local_a8.c = 0;
              local_a8.allocator = (Allocator *)0x0;
              local_a8.dims = 0;
              local_a8.w = 0;
              ncnn::Mat::create(&local_a8,iVar8,4,(Allocator *)0x0);
              piVar11 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
              if ((Mat *)&pLVar3[2].support_tensor_storage != &local_a8) {
                if (piVar11 != (int *)0x0) {
                  LOCK();
                  *piVar11 = *piVar11 + 1;
                  UNLOCK();
                }
                piVar11 = *(int **)&pLVar3[2].support_reserved_6;
                if (piVar11 != (int *)0x0) {
                  LOCK();
                  *piVar11 = *piVar11 + -1;
                  UNLOCK();
                  if (*piVar11 == 0) {
                    plVar7 = (long *)pLVar3[2].type._M_dataplus._M_p;
                    if (plVar7 == (long *)0x0) {
                      if (*(void **)&pLVar3[2].support_tensor_storage != (void *)0x0) {
                        free(*(void **)&pLVar3[2].support_tensor_storage);
                      }
                    }
                    else {
                      (**(code **)(*plVar7 + 0x18))();
                    }
                  }
                }
                *(void **)&pLVar3[2].support_tensor_storage = local_a8.data;
                piVar11 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
                *(int **)&pLVar3[2].support_reserved_6 = piVar11;
                pLVar3[2].userdata =
                     (void *)CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                pLVar3[2].typeindex = local_a8.elempack;
                pLVar3[2].type._M_dataplus._M_p = (pointer)local_a8.allocator;
                *(int *)&pLVar3[2].type._M_string_length = local_a8.dims;
                *(int *)((long)&pLVar3[2].type._M_string_length + 4) = local_a8.w;
                *(int *)&pLVar3[2].type.field_2 = local_a8.h;
                *(int *)((long)&pLVar3[2].type.field_2 + 4) = local_a8.d;
                *(int *)((long)&pLVar3[2].type.field_2 + 8) = local_a8.c;
                pLVar3[2].name._M_dataplus._M_p = (pointer)local_a8.cstep;
              }
              if (piVar11 != (int *)0x0) {
                LOCK();
                *piVar11 = *piVar11 + -1;
                UNLOCK();
                if (*piVar11 == 0) {
                  if (local_a8.allocator == (Allocator *)0x0) {
                    if (local_a8.data != (void *)0x0) {
                      free(local_a8.data);
                    }
                  }
                  else {
                    (*(local_a8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              uVar10 = *(int *)((long)&pLVar3[2].type.field_2 + 8) *
                       *(int *)&pLVar3[2].name._M_dataplus._M_p;
              __s = *(void **)&pLVar3[2].support_tensor_storage;
              if (0 < (int)uVar10) {
                memset(__s,0,(ulong)uVar10 << 2);
              }
            }
            else {
              __s = *(void **)&pLVar3[2].support_tensor_storage;
            }
            if (0 < iVar8) {
              piVar12 = pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              uVar13 = (long)*(int *)&pLVar3[1].type.field_2 / (long)iVar8;
              iVar8 = (int)uVar13;
              sVar14 = 0;
              do {
                if (0 < iVar8) {
                  uVar15 = 0;
                  do {
                    piVar12[uVar15] =
                         (int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[sVar14] * (float)piVar12[uVar15]);
                    uVar15 = uVar15 + 1;
                  } while ((uVar13 & 0xffffffff) != uVar15);
                }
                *(float *)((long)__s + sVar14 * 4) =
                     *(float *)((long)__s + sVar14 * 4) *
                     local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar14] +
                     local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar14];
                sVar14 = sVar14 + 1;
                piVar12 = piVar12 + iVar8;
              } while (sVar14 != __n);
            }
            if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            iVar8 = *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar8;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar8].producer = (int)lVar16;
            std::__cxx11::string::_M_replace
                      ((ulong)&pLVar5->type,0,(char *)(pLVar5->type)._M_string_length,0x52219a);
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != uVar17 + (uVar17 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_deconvolutiondepthwise_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "DeconvolutionDepthWise")
            continue;

        // DeconvolutionDepthWise - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse DeconvolutionDepthWise - BatchNorm to DeconvolutionDepthWise
        ncnn::DeconvolutionDepthWise* deconvolutiondepthwise = (ncnn::DeconvolutionDepthWise*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_deconvolutiondepthwise_batchnorm %s %s\n", deconvolutiondepthwise->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (deconvolutiondepthwise->bias_term == 0)
            {
                // init bias as zero
                deconvolutiondepthwise->bias_term = 1;
                deconvolutiondepthwise->bias_data = ncnn::Mat(channels);
                deconvolutiondepthwise->bias_data.fill(0.f);
            }

            const int weight_per_outch = deconvolutiondepthwise->weight_data_size / channels;

            float* weight = deconvolutiondepthwise->weight_data;
            float* bias = deconvolutiondepthwise->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        deconvolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}